

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_ahead(archive_read *a,size_t how_many,uint8_t **ptr)

{
  void *pvVar1;
  ssize_t local_30;
  ssize_t avail;
  uint8_t **ptr_local;
  size_t how_many_local;
  archive_read *a_local;
  
  local_30 = -1;
  if (ptr == (uint8_t **)0x0) {
    a_local._4_4_ = L'\0';
  }
  else {
    avail = (ssize_t)ptr;
    ptr_local = (uint8_t **)how_many;
    how_many_local = (size_t)a;
    pvVar1 = __archive_read_ahead(a,how_many,&local_30);
    *(void **)avail = pvVar1;
    if (*(long *)avail == 0) {
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int read_ahead(struct archive_read* a, size_t how_many,
    const uint8_t** ptr)
{
	ssize_t avail = -1;
	if(!ptr)
		return 0;

	*ptr = __archive_read_ahead(a, how_many, &avail);
	if(*ptr == NULL) {
		return 0;
	}

	return 1;
}